

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::OurReader::readObject(OurReader *this,Token *token)

{
  anon_struct_4_2_14fb5ae2_for_bits_ aVar1;
  TokenType TVar2;
  bool bVar3;
  char *pcVar4;
  Value *pVVar5;
  _Elt_pointer ppVVar6;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  Value numberName;
  String name;
  Token colon;
  Value init;
  Token comma;
  Token tokenName;
  ValueHolder local_f0;
  ulong local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined8 local_d0;
  String local_c8;
  String local_a8;
  ValueHolder local_88;
  anon_struct_4_2_14fb5ae2_for_bits_ local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  Token local_60;
  Token local_48;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_80._0_2_ = 7;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  pcVar4 = (char *)operator_new(0x30);
  pcVar4[0x10] = '\0';
  pcVar4[0x11] = '\0';
  pcVar4[0x12] = '\0';
  pcVar4[0x13] = '\0';
  pcVar4[0x14] = '\0';
  pcVar4[0x15] = '\0';
  pcVar4[0x16] = '\0';
  pcVar4[0x17] = '\0';
  pcVar4[0x18] = '\0';
  pcVar4[0x19] = '\0';
  pcVar4[0x1a] = '\0';
  pcVar4[0x1b] = '\0';
  pcVar4[0x1c] = '\0';
  pcVar4[0x1d] = '\0';
  pcVar4[0x1e] = '\0';
  pcVar4[0x1f] = '\0';
  pcVar4[0] = '\0';
  pcVar4[1] = '\0';
  pcVar4[2] = '\0';
  pcVar4[3] = '\0';
  pcVar4[4] = '\0';
  pcVar4[5] = '\0';
  pcVar4[6] = '\0';
  pcVar4[7] = '\0';
  pcVar4[8] = '\0';
  pcVar4[9] = '\0';
  pcVar4[10] = '\0';
  pcVar4[0xb] = '\0';
  pcVar4[0xc] = '\0';
  pcVar4[0xd] = '\0';
  pcVar4[0xe] = '\0';
  pcVar4[0xf] = '\0';
  *(char **)(pcVar4 + 0x18) = pcVar4 + 8;
  *(char **)(pcVar4 + 0x20) = pcVar4 + 8;
  pcVar4[0x28] = '\0';
  pcVar4[0x29] = '\0';
  pcVar4[0x2a] = '\0';
  pcVar4[0x2b] = '\0';
  pcVar4[0x2c] = '\0';
  pcVar4[0x2d] = '\0';
  pcVar4[0x2e] = '\0';
  pcVar4[0x2f] = '\0';
  ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar6 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pVVar5 = ppVVar6[-1];
  aVar1 = pVVar5->bits_;
  pVVar5->bits_ = local_80;
  local_88.map_ = *(ObjectValues **)&pVVar5->value_;
  (pVVar5->value_).string_ = pcVar4;
  ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar6 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ppVVar6[-1]->start_ = (long)token->start_ - (long)this->begin_;
  local_80 = aVar1;
  do {
    bVar3 = readToken(this,&local_48);
    if (!bVar3) {
LAB_0010b1a0:
      local_f0.string_ = (char *)&local_e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"Missing \'}\' or object member name","");
      addError(this,(String *)&local_f0,&local_48,(Location)0x0);
      recoverFromError(this,tokenObjectEnd);
LAB_0010b31c:
      if (local_f0 != &local_e0) {
        operator_delete(local_f0.string_,local_e0._M_allocated_capacity + 1);
      }
LAB_0010b338:
      bVar3 = false;
      goto LAB_0010b33a;
    }
    bVar3 = true;
    while( true ) {
      TVar2 = local_48.type_;
      if ((bVar3 == false) || (local_48.type_ != tokenComment)) break;
      bVar3 = readToken(this,&local_48);
    }
    if (bVar3 == false) goto LAB_0010b1a0;
    if (local_48.type_ == tokenObjectEnd) {
      bVar3 = true;
      if ((local_c8._M_string_length != 0) && ((this->features_).allowTrailingCommas_ == false)) {
        local_c8._M_string_length = 0;
        *local_c8._M_dataplus._M_p = '\0';
        goto LAB_0010b1a0;
      }
      goto LAB_0010b33a;
    }
    local_c8._M_string_length = 0;
    *local_c8._M_dataplus._M_p = '\0';
    if (TVar2 == tokenNumber) {
      if ((this->features_).allowNumericKeys_ != true) goto LAB_0010b1a0;
      local_e8 = local_e8 & 0xfffffffffffffe00;
      local_e0._M_allocated_capacity = 0;
      local_e0._8_8_ = 0;
      local_d0 = 0;
      bVar3 = decodeNumber(this,&local_48,(Value *)&local_f0);
      if (bVar3) {
        Value::asString_abi_cxx11_(&local_a8,(Value *)&local_f0);
        std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p) !=
            &local_a8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p),
                          local_a8.field_2._M_allocated_capacity + 1);
        }
        Value::~Value((Value *)&local_f0);
        goto LAB_0010b00f;
      }
      recoverFromError(this,tokenObjectEnd);
      Value::~Value((Value *)&local_f0);
      goto LAB_0010b338;
    }
    if (TVar2 != tokenString) goto LAB_0010b1a0;
    bVar3 = decodeString(this,&local_48,&local_c8);
    if (!bVar3) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_0010b338;
    }
LAB_0010b00f:
    if (0x3fffffff < local_c8._M_string_length) {
      local_f0.string_ = (char *)&local_e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"keylength >= 2^30","");
      throwRuntimeError((String *)&local_f0);
    }
    if ((this->features_).rejectDupKeys_ == true) {
      ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVVar6 ==
          (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      pVVar5 = Value::find(ppVVar6[-1],local_c8._M_dataplus._M_p,
                           local_c8._M_dataplus._M_p + local_c8._M_string_length);
      if (pVVar5 == (Value *)0x0) goto LAB_0010b05e;
      std::operator+(&local_a8,"Duplicate key: \'",&local_c8);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
      local_f0.string_ = (char *)&local_e0;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar8) {
        local_e0._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_e0._8_8_ = plVar7[3];
      }
      else {
        local_e0._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_f0.string_ = ((char *)*plVar7).string_;
      }
      local_e8 = plVar7[1];
      *plVar7 = (long)paVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p) !=
          &local_a8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p),
                        local_a8.field_2._M_allocated_capacity + 1);
      }
      addError(this,(String *)&local_f0,&local_48,(Location)0x0);
      recoverFromError(this,tokenObjectEnd);
      goto LAB_0010b31c;
    }
LAB_0010b05e:
    bVar3 = readToken(this,(Token *)&local_a8);
    if (!bVar3 || (int)local_a8._M_dataplus._M_p != 0xe) {
      local_f0.string_ = (char *)&local_e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"Missing \':\' after object member name","");
      addError(this,(String *)&local_f0,(Token *)&local_a8,(Location)0x0);
      recoverFromError(this,tokenObjectEnd);
      goto LAB_0010b31c;
    }
    ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar6 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    local_f0.map_ =
         (ObjectValues *)
         Value::resolveReference
                   (ppVVar6[-1],local_c8._M_dataplus._M_p,
                    local_c8._M_dataplus._M_p + local_c8._M_string_length);
    std::deque<Json::Value*,std::allocator<Json::Value*>>::emplace_back<Json::Value*>
              ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)&local_f0.map_);
    bVar3 = readValue(this);
    std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
              ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
    if (!bVar3) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_0010b338;
    }
    bVar3 = readToken(this,&local_60);
    if (((!bVar3) || (tokenComment < local_60.type_)) ||
       ((0xa004U >> (local_60.type_ & (tokenError|tokenComment)) & 1) == 0)) {
      local_f0.string_ = (char *)&local_e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"Missing \',\' or \'}\' in object declaration","");
      addError(this,(String *)&local_f0,&local_60,(Location)0x0);
      recoverFromError(this,tokenObjectEnd);
      goto LAB_0010b31c;
    }
    bVar3 = true;
    while ((bVar3 != false && (local_60.type_ == tokenComment))) {
      bVar3 = readToken(this,&local_60);
    }
  } while (local_60.type_ != tokenObjectEnd);
  bVar3 = true;
LAB_0010b33a:
  Value::~Value((Value *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  return bVar3;
}

Assistant:

bool OurReader::readObject(Token& token) {
  Token tokenName;
  String name;
  Value init(objectValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(token.start_ - begin_);
  while (readToken(tokenName)) {
    bool initialTokenOk = true;
    while (tokenName.type_ == tokenComment && initialTokenOk)
      initialTokenOk = readToken(tokenName);
    if (!initialTokenOk)
      break;
    if (tokenName.type_ == tokenObjectEnd &&
        (name.empty() ||
         features_.allowTrailingCommas_)) // empty object or trailing comma
      return true;
    name.clear();
    if (tokenName.type_ == tokenString) {
      if (!decodeString(tokenName, name))
        return recoverFromError(tokenObjectEnd);
    } else if (tokenName.type_ == tokenNumber && features_.allowNumericKeys_) {
      Value numberName;
      if (!decodeNumber(tokenName, numberName))
        return recoverFromError(tokenObjectEnd);
      name = numberName.asString();
    } else {
      break;
    }
    if (name.length() >= (1U << 30))
      throwRuntimeError("keylength >= 2^30");
    if (features_.rejectDupKeys_ && currentValue().isMember(name)) {
      String msg = "Duplicate key: '" + name + "'";
      return addErrorAndRecover(msg, tokenName, tokenObjectEnd);
    }

    Token colon;
    if (!readToken(colon) || colon.type_ != tokenMemberSeparator) {
      return addErrorAndRecover("Missing ':' after object member name", colon,
                                tokenObjectEnd);
    }
    Value& value = currentValue()[name];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenObjectEnd);

    Token comma;
    if (!readToken(comma) ||
        (comma.type_ != tokenObjectEnd && comma.type_ != tokenArraySeparator &&
         comma.type_ != tokenComment)) {
      return addErrorAndRecover("Missing ',' or '}' in object declaration",
                                comma, tokenObjectEnd);
    }
    bool finalizeTokenOk = true;
    while (comma.type_ == tokenComment && finalizeTokenOk)
      finalizeTokenOk = readToken(comma);
    if (comma.type_ == tokenObjectEnd)
      return true;
  }
  return addErrorAndRecover("Missing '}' or object member name", tokenName,
                            tokenObjectEnd);
}